

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall cmQtAutoGenInitializer::SetupWriteAutogenInfo(cmQtAutoGenInitializer *this)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  MUFile *pMVar3;
  pointer ppVar4;
  pointer ppVar5;
  long lVar6;
  cmQtAutoGenInitializer *pcVar7;
  pointer ppMVar8;
  bool bVar9;
  ulong uVar10;
  string *psVar11;
  Value *pVVar12;
  cmake *pcVar13;
  Value *pVVar14;
  Value *pVVar15;
  pointer ppMVar16;
  ArrayIndex AVar17;
  _Hash_node_base *p_Var18;
  pointer value;
  pointer value_00;
  __normal_iterator<const_cmQtAutoGenInitializer::MUFile_**,_std::vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>_>
  __i;
  long lVar19;
  pointer ppMVar20;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  MUFile *muf;
  InfoWriter info;
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  sources;
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  headers;
  anon_class_8_1_8991fb9c cfgArray;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uic_skip;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moc_skip;
  ValueHolder local_200;
  ValueHolder local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  _Hash_node_base *local_1e0;
  _Hash_node_base *local_1d8;
  cmQtAutoGenInitializer *local_1d0;
  string local_1c8;
  ValueHolder local_198 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  Value local_170;
  string local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  local_108;
  pointer local_e8;
  Value *local_e0;
  string local_d8;
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  local_b8;
  anon_class_8_1_8991fb9c local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8.
  super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.
  super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ::reserve(&local_b8,(this->AutogenTarget).Headers._M_h._M_element_count);
  p_Var18 = (this->AutogenTarget).Headers._M_h._M_before_begin._M_nxt;
  local_1d0 = this;
  if (p_Var18 != (_Hash_node_base *)0x0) {
    do {
      local_200 = (ValueHolder)((ValueHolder *)(p_Var18 + 2))->map_;
      if (*(char *)(local_200.int_ + 0x41) == '\x01') {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_200.map_);
      }
      if (*(char *)(local_200.int_ + 0x42) == '\x01') {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_200.map_);
      }
      if (((*(char *)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_200.int_ + 0x40))->_M_dataplus)._M_p != '\x01') ||
          (local_1d0->CMP0071Accept == true)) &&
         ((*(char *)(local_200.int_ + 0x43) != '\0' || (*(char *)(local_200.int_ + 0x44) == '\x01'))
         )) {
        std::
        vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
        ::emplace_back<cmQtAutoGenInitializer::MUFile_const*const&>
                  ((vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
                    *)&local_b8,(MUFile **)&local_200.map_);
      }
      p_Var18 = p_Var18->_M_nxt;
    } while (p_Var18 != (_Hash_node_base *)0x0);
  }
  ppMVar8 = local_b8.
            super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppMVar16 = local_b8.
             super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (local_b8.
      super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar19 = (long)local_b8.
                   super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b8.
                   super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar10 = lVar19 >> 3;
    lVar6 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>>
              (local_b8.
               super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_b8.
               super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar19 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>>
                (ppMVar16,ppMVar8);
    }
    else {
      ppMVar20 = ppMVar16 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>>
                (ppMVar16,ppMVar20);
      for (; ppMVar20 != ppMVar8; ppMVar20 = ppMVar20 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__1>>
                  (ppMVar20);
      }
    }
  }
  pcVar7 = local_1d0;
  std::
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  ::reserve(&local_108,(local_1d0->AutogenTarget).Sources._M_h._M_element_count);
  p_Var18 = (pcVar7->AutogenTarget).Sources._M_h._M_before_begin._M_nxt;
  if (p_Var18 != (_Hash_node_base *)0x0) {
    do {
      local_200 = (ValueHolder)((ValueHolder *)(p_Var18 + 2))->map_;
      if ((*(char *)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_200.int_ + 0x40))->_M_dataplus)._M_p != '\x01') ||
         (local_1d0->CMP0071Accept == true)) {
        if (*(char *)(local_200.int_ + 0x41) == '\x01') {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_200.map_);
        }
        if (*(char *)(local_200.int_ + 0x42) == '\x01') {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_200.map_);
        }
        if ((*(char *)(local_200.int_ + 0x43) != '\0') ||
           (*(char *)(local_200.int_ + 0x44) == '\x01')) {
          std::
          vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
          ::emplace_back<cmQtAutoGenInitializer::MUFile_const*const&>
                    ((vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>
                      *)&local_108,(MUFile **)&local_200.map_);
        }
      }
      p_Var18 = p_Var18->_M_nxt;
    } while (p_Var18 != (_Hash_node_base *)0x0);
  }
  ppMVar8 = local_108.
            super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppMVar16 = local_108.
             super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (local_108.
      super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_108.
      super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar19 = (long)local_108.
                   super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_108.
                   super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar10 = lVar19 >> 3;
    lVar6 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>>
              (local_108.
               super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_108.
               super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar19 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>>
                (ppMVar16);
    }
    else {
      ppMVar20 = ppMVar16 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>>
                (ppMVar16);
      for (; ppMVar20 != ppMVar8; ppMVar20 = ppMVar20 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmQtAutoGenInitializer::MUFile_const**,std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmQtAutoGenInitializer::SetupWriteAutogenInfo()::__2>>
                  (ppMVar20);
      }
    }
  }
  Json::Value::Value(&local_170,nullValue);
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"MULTI_CONFIG","");
  anon_unknown.dwarf_1d260d9::InfoWriter::SetBool
            ((InfoWriter *)&local_170,(string *)&local_200,local_1d0->MultiConfig);
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"PARALLEL","");
  anon_unknown.dwarf_1d260d9::InfoWriter::SetUInt
            ((InfoWriter *)&local_170,(string *)&local_200,(local_1d0->AutogenTarget).Parallel);
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"VERBOSITY","");
  anon_unknown.dwarf_1d260d9::InfoWriter::SetUInt
            ((InfoWriter *)&local_170,(string *)&local_200,local_1d0->Verbosity);
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"CMAKE_SOURCE_DIR","");
  local_198[0].string_ = (char *)&local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"CMAKE_SOURCE_DIR","");
  psVar11 = cmMakefile::GetSafeDefinition(local_1d0->Makefile,(string *)local_198);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  pcVar1 = (psVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar1,pcVar1 + psVar11->_M_string_length);
  anon_unknown.dwarf_1d260d9::InfoWriter::Set
            ((InfoWriter *)&local_170,(string *)&local_200,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  if (local_198[0] != &local_188) {
    operator_delete(local_198[0].string_,local_188._M_allocated_capacity + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"CMAKE_BINARY_DIR","");
  local_198[0].string_ = (char *)&local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"CMAKE_BINARY_DIR","");
  psVar11 = cmMakefile::GetSafeDefinition(local_1d0->Makefile,(string *)local_198);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  pcVar1 = (psVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar1,pcVar1 + psVar11->_M_string_length);
  anon_unknown.dwarf_1d260d9::InfoWriter::Set
            ((InfoWriter *)&local_170,(string *)&local_200,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  if (local_198[0] != &local_188) {
    operator_delete(local_198[0].string_,local_188._M_allocated_capacity + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,"CMAKE_CURRENT_SOURCE_DIR","");
  local_198[0].string_ = (char *)&local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"CMAKE_CURRENT_SOURCE_DIR","")
  ;
  psVar11 = cmMakefile::GetSafeDefinition(local_1d0->Makefile,(string *)local_198);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  pcVar1 = (psVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar1,pcVar1 + psVar11->_M_string_length);
  anon_unknown.dwarf_1d260d9::InfoWriter::Set
            ((InfoWriter *)&local_170,(string *)&local_200,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  if (local_198[0] != &local_188) {
    operator_delete(local_198[0].string_,local_188._M_allocated_capacity + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,"CMAKE_CURRENT_BINARY_DIR","");
  local_198[0].string_ = (char *)&local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"CMAKE_CURRENT_BINARY_DIR","")
  ;
  psVar11 = cmMakefile::GetSafeDefinition(local_1d0->Makefile,(string *)local_198);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  pcVar1 = (psVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar1,pcVar1 + psVar11->_M_string_length);
  anon_unknown.dwarf_1d260d9::InfoWriter::Set
            ((InfoWriter *)&local_170,(string *)&local_200,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  if (local_198[0] != &local_188) {
    operator_delete(local_198[0].string_,local_188._M_allocated_capacity + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"BUILD_DIR","");
  anon_unknown.dwarf_1d260d9::InfoWriter::Set
            ((InfoWriter *)&local_170,(string *)&local_200,&(local_1d0->Dir).Build);
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"INCLUDE_DIR","");
  anon_unknown.dwarf_1d260d9::InfoWriter::SetConfig
            ((InfoWriter *)&local_170,(string *)&local_200,&(local_1d0->Dir).Include);
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"QT_VERSION_MAJOR","");
  anon_unknown.dwarf_1d260d9::InfoWriter::SetUInt
            ((InfoWriter *)&local_170,(string *)&local_200,(local_1d0->QtVersion).Major);
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"QT_VERSION_MINOR","");
  anon_unknown.dwarf_1d260d9::InfoWriter::SetUInt
            ((InfoWriter *)&local_170,(string *)&local_200,(local_1d0->QtVersion).Minor);
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"QT_MOC_EXECUTABLE","");
  anon_unknown.dwarf_1d260d9::InfoWriter::Set
            ((InfoWriter *)&local_170,(string *)&local_200,
             &(local_1d0->Moc).super_GenVarsT.Executable);
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"QT_UIC_EXECUTABLE","");
  anon_unknown.dwarf_1d260d9::InfoWriter::Set
            ((InfoWriter *)&local_170,(string *)&local_200,
             &(local_1d0->Uic).super_GenVarsT.Executable);
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"CMAKE_EXECUTABLE","");
  psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  anon_unknown.dwarf_1d260d9::InfoWriter::Set((InfoWriter *)&local_170,(string *)&local_200,psVar11)
  ;
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"SETTINGS_FILE","");
  anon_unknown.dwarf_1d260d9::InfoWriter::SetConfig
            ((InfoWriter *)&local_170,(string *)&local_200,&(local_1d0->AutogenTarget).SettingsFile)
  ;
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"PARSE_CACHE_FILE","");
  anon_unknown.dwarf_1d260d9::InfoWriter::SetConfig
            ((InfoWriter *)&local_170,(string *)&local_200,
             &(local_1d0->AutogenTarget).ParseCacheFile);
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"DEP_FILE","");
  anon_unknown.dwarf_1d260d9::InfoWriter::Set
            ((InfoWriter *)&local_170,(string *)&local_200,&(local_1d0->AutogenTarget).DepFile);
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"DEP_FILE_RULE_NAME","");
  anon_unknown.dwarf_1d260d9::InfoWriter::Set
            ((InfoWriter *)&local_170,(string *)&local_200,
             &(local_1d0->AutogenTarget).DepFileRuleName);
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"CMAKE_LIST_FILES","");
  pcVar2 = local_1d0->Makefile;
  pVVar12 = Json::Value::operator[](&local_170,(String *)&local_200);
  (anonymous_namespace)::InfoWriter::
  MakeStringArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (pVVar12,&pcVar2->ListFiles);
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_200.string_ = (char *)&local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"HEADER_EXTENSIONS","");
  pcVar13 = cmMakefile::GetCMakeInstance(local_1d0->Makefile);
  pVVar12 = Json::Value::operator[](&local_170,(String *)&local_200);
  (anonymous_namespace)::InfoWriter::
  MakeStringArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (pVVar12,&(pcVar13->HeaderFileExtensions).ordered);
  if (local_200 != &local_1f0) {
    operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
  }
  local_98.this = local_1d0;
  local_128._M_allocated_capacity = (size_type)&local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"HEADERS","");
  pVVar12 = Json::Value::operator[](&local_170,(String *)&local_128);
  bVar9 = (anonymous_namespace)::InfoWriter::
          MakeArray<std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>
                    (pVVar12,&local_b8);
  local_e0 = pVVar12;
  if ((bVar9) &&
     (local_e8 = local_b8.
                 super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
     local_b8.
     super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
     ._M_impl.super__Vector_impl_data._M_start !=
     local_b8.
     super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    AVar17 = 0;
    ppMVar16 = local_b8.
               super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      pVVar12 = Json::Value::operator[](local_e0,AVar17);
      Json::Value::Value((Value *)&local_200,arrayValue);
      Json::Value::operator=(pVVar12,(Value *)&local_200);
      Json::Value::~Value((Value *)&local_200);
      pMVar3 = *ppMVar16;
      Json::Value::resize(pVVar12,4);
      Json::Value::Value((Value *)&local_200,&pMVar3->FullPath);
      pVVar14 = Json::Value::operator[](pVVar12,0);
      Json::Value::operator=(pVVar14,(Value *)&local_200);
      Json::Value::~Value((Value *)&local_200);
      local_200.int_ = (LargestInt)&DAT_00000001;
      local_1f8.string_ = (char *)&local_1f0;
      local_1f0._M_allocated_capacity =
           CONCAT71(local_1f0._M_allocated_capacity._1_7_,(pMVar3->MocIt ^ 1U) << 5) | 0x4d;
      local_1c8.field_2._M_local_buf[0] = (pMVar3->UicIt ^ 1U) << 5 | 0x55;
      local_1c8._M_dataplus._M_p = &DAT_00000001;
      local_1c8._M_string_length = (size_type)&local_1c8.field_2;
      local_148._M_dataplus._M_p = &DAT_00000001;
      local_148.field_2._M_allocated_capacity = (size_type)&DAT_00000001;
      views._M_len = 2;
      views._M_array = (iterator)&local_148;
      local_148._M_string_length = (size_type)local_1f8.string_;
      local_148.field_2._8_8_ = local_1c8._M_string_length;
      cmCatViews_abi_cxx11_(&local_d8,views);
      Json::Value::Value((Value *)local_198,&local_d8);
      pVVar14 = Json::Value::operator[](pVVar12,1);
      Json::Value::operator=(pVVar14,(Value *)local_198);
      Json::Value::~Value((Value *)local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      GetMocBuildPath_abi_cxx11_(&local_1c8,local_1d0,pMVar3);
      Json::Value::Value((Value *)&local_200,&local_1c8);
      pVVar14 = Json::Value::operator[](pVVar12,2);
      Json::Value::operator=(pVVar14,(Value *)&local_200);
      Json::Value::~Value((Value *)&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,
                        CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                 local_1c8.field_2._M_local_buf[0]) + 1);
      }
      SetupWriteAutogenInfo::anon_class_8_1_8991fb9c::operator()
                ((Value *)&local_200,&local_98,&pMVar3->Configs);
      pVVar12 = Json::Value::operator[](pVVar12,3);
      Json::Value::operator=(pVVar12,(Value *)&local_200);
      Json::Value::~Value((Value *)&local_200);
      ppMVar16 = ppMVar16 + 1;
      AVar17 = AVar17 + 1;
    } while (ppMVar16 != local_e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_allocated_capacity != &local_118) {
    operator_delete((void *)local_128._M_allocated_capacity,local_118._M_allocated_capacity + 1);
  }
  local_128._M_allocated_capacity = (size_type)&local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"SOURCES","");
  pVVar12 = Json::Value::operator[](&local_170,(String *)&local_128);
  bVar9 = (anonymous_namespace)::InfoWriter::
          MakeArray<std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>
                    (pVVar12,&local_108);
  local_e0 = pVVar12;
  if ((bVar9) &&
     (local_e8 = local_108.
                 super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
     local_108.
     super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
     ._M_impl.super__Vector_impl_data._M_start !=
     local_108.
     super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    AVar17 = 0;
    ppMVar16 = local_108.
               super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      pVVar12 = Json::Value::operator[](local_e0,AVar17);
      Json::Value::Value((Value *)&local_200,arrayValue);
      Json::Value::operator=(pVVar12,(Value *)&local_200);
      Json::Value::~Value((Value *)&local_200);
      pMVar3 = *ppMVar16;
      Json::Value::resize(pVVar12,3);
      Json::Value::Value((Value *)&local_200,&pMVar3->FullPath);
      pVVar14 = Json::Value::operator[](pVVar12,0);
      Json::Value::operator=(pVVar14,(Value *)&local_200);
      Json::Value::~Value((Value *)&local_200);
      local_200.int_ = (LargestInt)&DAT_00000001;
      local_1f8.string_ = (char *)&local_1f0;
      local_1f0._M_allocated_capacity =
           CONCAT71(local_1f0._M_allocated_capacity._1_7_,(pMVar3->MocIt ^ 1U) << 5) | 0x4d;
      local_1c8.field_2._M_local_buf[0] = (pMVar3->UicIt ^ 1U) << 5 | 0x55;
      local_1c8._M_dataplus._M_p = &DAT_00000001;
      local_1c8._M_string_length = (size_type)&local_1c8.field_2;
      local_148._M_dataplus._M_p = &DAT_00000001;
      local_148.field_2._M_allocated_capacity = (size_type)&DAT_00000001;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&local_148;
      local_148._M_string_length = (size_type)local_1f8.string_;
      local_148.field_2._8_8_ = local_1c8._M_string_length;
      cmCatViews_abi_cxx11_(&local_d8,views_00);
      Json::Value::Value((Value *)local_198,&local_d8);
      pVVar14 = Json::Value::operator[](pVVar12,1);
      Json::Value::operator=(pVVar14,(Value *)local_198);
      Json::Value::~Value((Value *)local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      SetupWriteAutogenInfo::anon_class_8_1_8991fb9c::operator()
                ((Value *)&local_200,&local_98,&pMVar3->Configs);
      pVVar12 = Json::Value::operator[](pVVar12,2);
      Json::Value::operator=(pVVar12,(Value *)&local_200);
      Json::Value::~Value((Value *)&local_200);
      ppMVar16 = ppMVar16 + 1;
      AVar17 = AVar17 + 1;
    } while (ppMVar16 != local_e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_allocated_capacity != &local_118) {
    operator_delete((void *)local_128._M_allocated_capacity,local_118._M_allocated_capacity + 1);
  }
  if ((local_1d0->Moc).super_GenVarsT.Enabled == true) {
    local_200.string_ = (char *)&local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"MOC_SKIP","");
    (anonymous_namespace)::InfoWriter::
    SetArray<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)&local_170,(string *)&local_200,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_60);
    if (local_200 != &local_1f0) {
      operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"MOC_DEFINITIONS","");
    pcVar7 = local_1d0;
    (anonymous_namespace)::InfoWriter::
    SetArray<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)&local_170,&local_148,&(local_1d0->Moc).Defines.Default);
    p_Var18 = (pcVar7->Moc).Defines.Config._M_h._M_before_begin._M_nxt;
    if (p_Var18 != (_Hash_node_base *)0x0) {
      do {
        local_1c8._M_dataplus._M_p = &DAT_00000001;
        local_1f0._8_8_ = &local_1c8.field_2;
        local_1c8.field_2._M_local_buf[0] = 0x5f;
        local_200 = (ValueHolder)local_148._M_string_length;
        local_1f8.string_ = local_148._M_dataplus._M_p;
        local_1f0._M_allocated_capacity = (size_type)&DAT_00000001;
        local_1d8 = p_Var18[1]._M_nxt;
        local_1e0 = p_Var18[2]._M_nxt;
        views_01._M_len = 3;
        views_01._M_array = (iterator)&local_200;
        local_1c8._M_string_length = local_1f0._8_8_;
        cmCatViews_abi_cxx11_((string *)local_198,views_01);
        (anonymous_namespace)::InfoWriter::
        SetArray<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                  ((InfoWriter *)&local_170,(string *)local_198,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(p_Var18 + 5));
        if (local_198[0] != &local_188) {
          operator_delete(local_198[0].string_,local_188._M_allocated_capacity + 1);
        }
        p_Var18 = p_Var18->_M_nxt;
      } while (p_Var18 != (_Hash_node_base *)0x0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,
                      (ulong)(local_148.field_2._M_allocated_capacity + 1));
    }
    local_200.string_ = (char *)&local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"MOC_INCLUDES","");
    (anonymous_namespace)::InfoWriter::
    SetConfigArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)&local_170,(string *)&local_200,&(local_1d0->Moc).Includes);
    if (local_200 != &local_1f0) {
      operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
    }
    local_200.string_ = (char *)&local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"MOC_OPTIONS","");
    pVVar12 = Json::Value::operator[](&local_170,(String *)&local_200);
    (anonymous_namespace)::InfoWriter::
    MakeStringArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (pVVar12,&(local_1d0->Moc).Options);
    if (local_200 != &local_1f0) {
      operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
    }
    local_200.string_ = (char *)&local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"MOC_RELAXED_MODE","");
    anon_unknown.dwarf_1d260d9::InfoWriter::SetBool
              ((InfoWriter *)&local_170,(string *)&local_200,(local_1d0->Moc).RelaxedMode);
    if (local_200 != &local_1f0) {
      operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
    }
    local_200.string_ = (char *)&local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"MOC_PATH_PREFIX","");
    anon_unknown.dwarf_1d260d9::InfoWriter::SetBool
              ((InfoWriter *)&local_170,(string *)&local_200,(local_1d0->Moc).PathPrefix);
    if (local_200 != &local_1f0) {
      operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
    }
    local_200.string_ = (char *)&local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"MOC_MACRO_NAMES","");
    pVVar12 = Json::Value::operator[](&local_170,(String *)&local_200);
    (anonymous_namespace)::InfoWriter::
    MakeStringArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (pVVar12,&(local_1d0->Moc).MacroNames);
    if (local_200 != &local_1f0) {
      operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
    }
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"MOC_DEPEND_FILTERS","");
    pVVar12 = Json::Value::operator[](&local_170,&local_1c8);
    Json::Value::Value((Value *)&local_200,arrayValue);
    Json::Value::operator=(pVVar12,(Value *)&local_200);
    Json::Value::~Value((Value *)&local_200);
    uVar10 = (long)(local_1d0->Moc).DependFilters.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_1d0->Moc).DependFilters.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (uVar10 != 0) {
      Json::Value::resize(pVVar12,(ArrayIndex)(uVar10 >> 6));
      value = (local_1d0->Moc).DependFilters.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 = (local_1d0->Moc).DependFilters.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (value != ppVar4) {
        AVar17 = 0;
        do {
          pVVar14 = Json::Value::operator[](pVVar12,AVar17);
          Json::Value::Value((Value *)&local_200,arrayValue);
          Json::Value::operator=(pVVar14,(Value *)&local_200);
          Json::Value::~Value((Value *)&local_200);
          Json::Value::resize(pVVar14,2);
          Json::Value::Value((Value *)&local_200,&value->first);
          pVVar15 = Json::Value::operator[](pVVar14,0);
          Json::Value::operator=(pVVar15,(Value *)&local_200);
          Json::Value::~Value((Value *)&local_200);
          Json::Value::Value((Value *)&local_200,&value->second);
          pVVar14 = Json::Value::operator[](pVVar14,1);
          Json::Value::operator=(pVVar14,(Value *)&local_200);
          Json::Value::~Value((Value *)&local_200);
          value = value + 1;
          AVar17 = AVar17 + 1;
        } while (value != ppVar4);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                               local_1c8.field_2._M_local_buf[0]) + 1);
    }
    local_200.string_ = (char *)&local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"MOC_COMPILATION_FILE","");
    anon_unknown.dwarf_1d260d9::InfoWriter::SetConfig
              ((InfoWriter *)&local_170,(string *)&local_200,&(local_1d0->Moc).CompilationFile);
    if (local_200 != &local_1f0) {
      operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
    }
    local_200.string_ = (char *)&local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"MOC_PREDEFS_CMD","");
    pVVar12 = Json::Value::operator[](&local_170,(String *)&local_200);
    (anonymous_namespace)::InfoWriter::
    MakeStringArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (pVVar12,&(local_1d0->Moc).PredefsCmd);
    if (local_200 != &local_1f0) {
      operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
    }
    local_200.string_ = (char *)&local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"MOC_PREDEFS_FILE","");
    anon_unknown.dwarf_1d260d9::InfoWriter::SetConfig
              ((InfoWriter *)&local_170,(string *)&local_200,&(local_1d0->Moc).PredefsFile);
    if (local_200 != &local_1f0) {
      operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
    }
  }
  if ((local_1d0->Uic).super_GenVarsT.Enabled == true) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_90,
               (local_1d0->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&(local_1d0->Uic).SkipUi._M_t._M_impl.super__Rb_tree_header);
    local_200.string_ = (char *)&local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"UIC_SKIP","");
    (anonymous_namespace)::InfoWriter::
    SetArray<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)&local_170,(string *)&local_200,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_90);
    if (local_200 != &local_1f0) {
      operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
    }
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"UIC_UI_FILES","");
    pVVar12 = Json::Value::operator[](&local_170,&local_1c8);
    Json::Value::Value((Value *)&local_200,arrayValue);
    Json::Value::operator=(pVVar12,(Value *)&local_200);
    Json::Value::~Value((Value *)&local_200);
    uVar10 = (long)(local_1d0->Uic).UiFilesWithOptions.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_1d0->Uic).UiFilesWithOptions.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (uVar10 != 0) {
      Json::Value::resize(pVVar12,(int)(uVar10 >> 3) * -0x49249249);
      value_00 = (local_1d0->Uic).UiFilesWithOptions.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVar5 = (local_1d0->Uic).UiFilesWithOptions.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (value_00 != ppVar5) {
        AVar17 = 0;
        do {
          pVVar14 = Json::Value::operator[](pVVar12,AVar17);
          Json::Value::Value((Value *)&local_200,arrayValue);
          Json::Value::operator=(pVVar14,(Value *)&local_200);
          Json::Value::~Value((Value *)&local_200);
          Json::Value::resize(pVVar14,2);
          Json::Value::Value((Value *)&local_200,&value_00->first);
          pVVar15 = Json::Value::operator[](pVVar14,0);
          Json::Value::operator=(pVVar15,(Value *)&local_200);
          Json::Value::~Value((Value *)&local_200);
          pVVar14 = Json::Value::operator[](pVVar14,1);
          (anonymous_namespace)::InfoWriter::
          MakeStringArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (pVVar14,&value_00->second);
          value_00 = value_00 + 1;
          AVar17 = AVar17 + 1;
        } while (value_00 != ppVar5);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                               local_1c8.field_2._M_local_buf[0]) + 1);
    }
    local_200.string_ = (char *)&local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"UIC_OPTIONS","");
    (anonymous_namespace)::InfoWriter::
    SetConfigArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((InfoWriter *)&local_170,(string *)&local_200,&(local_1d0->Uic).Options);
    if (local_200 != &local_1f0) {
      operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
    }
    local_200.string_ = (char *)&local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"UIC_SEARCH_PATHS","");
    pVVar12 = Json::Value::operator[](&local_170,(String *)&local_200);
    (anonymous_namespace)::InfoWriter::
    MakeStringArray<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (pVVar12,&(local_1d0->Uic).SearchPaths);
    if (local_200 != &local_1f0) {
      operator_delete(local_200.string_,(ulong)(local_1f0._M_allocated_capacity + 1));
    }
  }
  anon_unknown.dwarf_1d260d9::InfoWriter::Save
            ((InfoWriter *)&local_170,&(local_1d0->AutogenTarget).InfoFile);
  Json::Value::~Value(&local_170);
  if (local_108.
      super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.
      super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::SetupWriteAutogenInfo()
{
  // Utility lambdas
  auto MfDef = [this](std::string const& key) {
    return this->Makefile->GetSafeDefinition(key);
  };

  // Filtered headers and sources
  std::set<std::string> moc_skip;
  std::set<std::string> uic_skip;
  std::vector<MUFile const*> headers;
  std::vector<MUFile const*> sources;

  // Filter headers
  {
    headers.reserve(this->AutogenTarget.Headers.size());
    for (auto const& pair : this->AutogenTarget.Headers) {
      MUFile const* const muf = pair.second.get();
      if (muf->SkipMoc) {
        moc_skip.insert(muf->FullPath);
      }
      if (muf->SkipUic) {
        uic_skip.insert(muf->FullPath);
      }
      if (muf->Generated && !this->CMP0071Accept) {
        continue;
      }
      if (muf->MocIt || muf->UicIt) {
        headers.emplace_back(muf);
      }
    }
    std::sort(headers.begin(), headers.end(),
              [](MUFile const* a, MUFile const* b) {
                return (a->FullPath < b->FullPath);
              });
  }

  // Filter sources
  {
    sources.reserve(this->AutogenTarget.Sources.size());
    for (auto const& pair : this->AutogenTarget.Sources) {
      MUFile const* const muf = pair.second.get();
      if (muf->Generated && !this->CMP0071Accept) {
        continue;
      }
      if (muf->SkipMoc) {
        moc_skip.insert(muf->FullPath);
      }
      if (muf->SkipUic) {
        uic_skip.insert(muf->FullPath);
      }
      if (muf->MocIt || muf->UicIt) {
        sources.emplace_back(muf);
      }
    }
    std::sort(sources.begin(), sources.end(),
              [](MUFile const* a, MUFile const* b) {
                return (a->FullPath < b->FullPath);
              });
  }

  // Info writer
  InfoWriter info;

  // General
  info.SetBool("MULTI_CONFIG", this->MultiConfig);
  info.SetUInt("PARALLEL", this->AutogenTarget.Parallel);
  info.SetUInt("VERBOSITY", this->Verbosity);

  // Directories
  info.Set("CMAKE_SOURCE_DIR", MfDef("CMAKE_SOURCE_DIR"));
  info.Set("CMAKE_BINARY_DIR", MfDef("CMAKE_BINARY_DIR"));
  info.Set("CMAKE_CURRENT_SOURCE_DIR", MfDef("CMAKE_CURRENT_SOURCE_DIR"));
  info.Set("CMAKE_CURRENT_BINARY_DIR", MfDef("CMAKE_CURRENT_BINARY_DIR"));
  info.Set("BUILD_DIR", this->Dir.Build);
  info.SetConfig("INCLUDE_DIR", this->Dir.Include);

  info.SetUInt("QT_VERSION_MAJOR", this->QtVersion.Major);
  info.SetUInt("QT_VERSION_MINOR", this->QtVersion.Minor);
  info.Set("QT_MOC_EXECUTABLE", this->Moc.Executable);
  info.Set("QT_UIC_EXECUTABLE", this->Uic.Executable);

  info.Set("CMAKE_EXECUTABLE", cmSystemTools::GetCMakeCommand());
  info.SetConfig("SETTINGS_FILE", this->AutogenTarget.SettingsFile);
  info.SetConfig("PARSE_CACHE_FILE", this->AutogenTarget.ParseCacheFile);
  info.Set("DEP_FILE", this->AutogenTarget.DepFile);
  info.Set("DEP_FILE_RULE_NAME", this->AutogenTarget.DepFileRuleName);
  info.SetArray("CMAKE_LIST_FILES", this->Makefile->GetListFiles());
  info.SetArray("HEADER_EXTENSIONS",
                this->Makefile->GetCMakeInstance()->GetHeaderExtensions());
  auto cfgArray = [this](std::vector<size_t> const& configs) -> Json::Value {
    Json::Value value;
    if (!configs.empty()) {
      value = Json::arrayValue;
      for (size_t ci : configs) {
        value.append(this->ConfigsList[ci]);
      }
    }
    return value;
  };
  info.SetArrayArray("HEADERS", headers,
                     [this, &cfgArray](Json::Value& jval, MUFile const* muf) {
                       jval.resize(4u);
                       jval[0u] = muf->FullPath;
                       jval[1u] = cmStrCat(muf->MocIt ? 'M' : 'm',
                                           muf->UicIt ? 'U' : 'u');
                       jval[2u] = this->GetMocBuildPath(*muf);
                       jval[3u] = cfgArray(muf->Configs);
                     });
  info.SetArrayArray(
    "SOURCES", sources, [&cfgArray](Json::Value& jval, MUFile const* muf) {
      jval.resize(3u);
      jval[0u] = muf->FullPath;
      jval[1u] = cmStrCat(muf->MocIt ? 'M' : 'm', muf->UicIt ? 'U' : 'u');
      jval[2u] = cfgArray(muf->Configs);
    });

  // Write moc settings
  if (this->Moc.Enabled) {
    info.SetArray("MOC_SKIP", moc_skip);
    info.SetConfigArray("MOC_DEFINITIONS", this->Moc.Defines);
    info.SetConfigArray("MOC_INCLUDES", this->Moc.Includes);
    info.SetArray("MOC_OPTIONS", this->Moc.Options);
    info.SetBool("MOC_RELAXED_MODE", this->Moc.RelaxedMode);
    info.SetBool("MOC_PATH_PREFIX", this->Moc.PathPrefix);
    info.SetArray("MOC_MACRO_NAMES", this->Moc.MacroNames);
    info.SetArrayArray(
      "MOC_DEPEND_FILTERS", this->Moc.DependFilters,
      [](Json::Value& jval, std::pair<std::string, std::string> const& pair) {
        jval.resize(2u);
        jval[0u] = pair.first;
        jval[1u] = pair.second;
      });
    info.SetConfig("MOC_COMPILATION_FILE", this->Moc.CompilationFile);
    info.SetArray("MOC_PREDEFS_CMD", this->Moc.PredefsCmd);
    info.SetConfig("MOC_PREDEFS_FILE", this->Moc.PredefsFile);
  }

  // Write uic settings
  if (this->Uic.Enabled) {
    // Add skipped .ui files
    uic_skip.insert(this->Uic.SkipUi.begin(), this->Uic.SkipUi.end());

    info.SetArray("UIC_SKIP", uic_skip);
    info.SetArrayArray("UIC_UI_FILES", this->Uic.UiFilesWithOptions,
                       [](Json::Value& jval, UicT::UiFileT const& uiFile) {
                         jval.resize(2u);
                         jval[0u] = uiFile.first;
                         InfoWriter::MakeStringArray(jval[1u], uiFile.second);
                       });
    info.SetConfigArray("UIC_OPTIONS", this->Uic.Options);
    info.SetArray("UIC_SEARCH_PATHS", this->Uic.SearchPaths);
  }

  info.Save(this->AutogenTarget.InfoFile);

  return true;
}